

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

char * strip_absolute_path(bsdtar *bsdtar,char *p)

{
  char cVar1;
  byte bVar2;
  byte *pbVar3;
  byte *pbVar4;
  long lVar5;
  
  bVar2 = *p;
  if (((((bVar2 == 0x5c) || (bVar2 == 0x2f)) && ((p[1] == '\\' || (p[1] == '/')))) &&
      ((cVar1 = p[2], cVar1 == '?' || (cVar1 == '.')))) && ((p[3] == '\\' || (p[3] == '/')))) {
    lVar5 = 4;
    if ((((cVar1 == '?') && ((byte)(p[4] | 0x20U) == 0x75)) && ((byte)(p[5] | 0x20U) == 0x6e)) &&
       ((byte)(p[6] | 0x20U) == 99)) {
      lVar5 = 8;
      if (p[7] != '/') {
        lVar5 = (ulong)(p[7] == '\\') * 4 + 4;
      }
    }
    warn_strip_drive_letter(bsdtar);
    bVar2 = p[lVar5];
    p = p + lVar5;
  }
  do {
    pbVar3 = (byte *)p;
    p = (char *)pbVar3;
    if (((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a) && (pbVar3[1] == 0x3a)) {
      warn_strip_drive_letter(bsdtar);
      p = (char *)(pbVar3 + 2);
    }
    while ((bVar2 = *p, bVar2 == 0x5c || (bVar2 == 0x2f))) {
      if (((byte *)p)[1] == 0x2e) {
        pbVar4 = (byte *)p + 2;
        bVar2 = ((byte *)p)[2];
        if ((bVar2 != 0x5c) && (bVar2 != 0x2f)) {
          if (bVar2 == 0x2e) {
            pbVar4 = (byte *)p + 3;
            if ((((byte *)p)[3] == 0x2f) || (((byte *)p)[3] == 0x5c)) goto LAB_0010e681;
          }
          goto LAB_0010e67b;
        }
      }
      else {
LAB_0010e67b:
        pbVar4 = (byte *)p + 1;
      }
LAB_0010e681:
      p = (char *)pbVar4;
      if (bsdtar->warned_lead_slash == '\0') {
        lafe_warnc(0,"Removing leading \'%c\' from member names",(ulong)(uint)(int)(char)*pbVar3);
        bsdtar->warned_lead_slash = '\x01';
      }
    }
    if (pbVar3 == (byte *)p) {
      return (char *)pbVar3;
    }
  } while( true );
}

Assistant:

static const char*
strip_absolute_path(struct bsdtar *bsdtar, const char *p)
{
	const char *rp;

	/* Remove leading "//./" or "//?/" or "//?/UNC/"
	 * (absolute path prefixes used by Windows API) */
	if ((p[0] == '/' || p[0] == '\\') &&
	    (p[1] == '/' || p[1] == '\\') &&
	    (p[2] == '.' || p[2] == '?') &&
	    (p[3] == '/' || p[3] == '\\'))
	{
		if (p[2] == '?' &&
		    (p[4] == 'U' || p[4] == 'u') &&
		    (p[5] == 'N' || p[5] == 'n') &&
		    (p[6] == 'C' || p[6] == 'c') &&
		    (p[7] == '/' || p[7] == '\\'))
			p += 8;
		else
			p += 4;
		warn_strip_drive_letter(bsdtar);
	}

	/* Remove multiple leading slashes and Windows drive letters. */
	do {
		rp = p;
		if (((p[0] >= 'a' && p[0] <= 'z') ||
		     (p[0] >= 'A' && p[0] <= 'Z')) &&
		    p[1] == ':') {
			p += 2;
			warn_strip_drive_letter(bsdtar);
		}

		/* Remove leading "/../", "/./", "//", etc. */
		while (p[0] == '/' || p[0] == '\\') {
			if (p[1] == '.' &&
			    p[2] == '.' &&
			    (p[3] == '/' || p[3] == '\\')) {
				p += 3; /* Remove "/..", leave "/" for next pass. */
			} else if (p[1] == '.' &&
				   (p[2] == '/' || p[2] == '\\')) {
				p += 2; /* Remove "/.", leave "/" for next pass. */
			} else
				p += 1; /* Remove "/". */
			warn_strip_leading_char(bsdtar, rp);
		}
	} while (rp != p);

	return (p);
}